

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_resize.c
# Opt level: O1

int cvBuildNordsieckArrayBDF
              (sunrealtype *t,N_Vector *y,N_Vector f,N_Vector *wrk,int order,sunrealtype hscale,
              N_Vector *zn)

{
  N_Vector *pp_Var1;
  double dVar2;
  N_Vector p_Var3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  double *pdVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  N_Vector *pp_Var12;
  double dVar13;
  undefined1 auVar14 [16];
  sunrealtype t_ext [6];
  sunrealtype local_70;
  double local_68;
  undefined1 local_60 [48];
  
  auVar14._0_4_ = -(uint)(t == (sunrealtype *)0x0);
  auVar14._4_4_ = -(uint)(y == (N_Vector *)0x0);
  auVar14._8_4_ = -(uint)(f == (N_Vector)0x0);
  auVar14._12_4_ = -(uint)(wrk == (N_Vector *)0x0);
  iVar5 = movmskps((int)f,auVar14);
  iVar9 = -0x16;
  if (((zn != (N_Vector *)0x0 && 0 < order) && iVar5 == 0) && (*y != (N_Vector)0x0)) {
    uVar8 = (ulong)(uint)order;
    uVar6 = 0;
    do {
      if (uVar8 - 1 == uVar6) goto LAB_00118d6a;
      uVar11 = uVar6 + 1;
      lVar10 = uVar6 + 1;
      uVar6 = uVar11;
    } while (y[lVar10] != (N_Vector)0x0);
    if (uVar8 <= uVar11) {
LAB_00118d6a:
      if (*wrk != (N_Vector)0x0) {
        uVar6 = 0xffffffffffffffff;
        do {
          if ((1 - (ulong)(order + 1)) + uVar6 == -1) goto LAB_00118db5;
          uVar11 = uVar6 + 1;
          lVar10 = uVar6 + 2;
          uVar6 = uVar11;
        } while (wrk[lVar10] != (N_Vector)0x0);
        if (uVar8 <= uVar11) {
LAB_00118db5:
          local_70 = hscale;
          if (1 < order) {
            dVar2 = *t;
            local_68 = dVar2;
            memcpy(local_60,t,uVar8 * 8);
            N_VScale(0x3ff0000000000000,*y,*wrk);
            uVar6 = 0;
            do {
              N_VScale(0x3ff0000000000000,y[uVar6],wrk[uVar6 + 1]);
              uVar6 = uVar6 + 1;
            } while (uVar8 != uVar6);
            iVar5 = 1;
            if (1 < order) {
              iVar5 = order;
            }
            uVar6 = 1;
            pdVar7 = &local_68;
            lVar10 = uVar8 + 1;
            do {
              do {
                if (lVar10 == 2 && uVar6 == 1) {
                  N_VScale(f,wrk[1]);
                }
                else {
                  dVar13 = 1.0 / (pdVar7[lVar10 + -2] - (&local_70)[lVar10]);
                  N_VLinearSum(dVar13,-dVar13,wrk[lVar10 + -2],wrk[lVar10 + -1]);
                }
                lVar10 = lVar10 + -1;
              } while ((long)uVar6 < lVar10);
              uVar6 = uVar6 + 1;
              pdVar7 = pdVar7 + -1;
              lVar10 = uVar8 + 1;
            } while (uVar6 != iVar5 + 1);
            N_VScale(0x3ff0000000000000,wrk[uVar8],*zn);
            uVar6 = 1;
            if (1 < order) {
              uVar6 = (ulong)(uint)order;
            }
            uVar11 = 0;
            do {
              N_VConst(0,zn[uVar11 + 1]);
              uVar11 = uVar11 + 1;
            } while (uVar6 != uVar11);
            uVar6 = uVar8;
            do {
              uVar11 = uVar6 - 1;
              dVar13 = *(double *)(local_60 + (uVar11 & 0xffffffff) * 8 + -8);
              pp_Var12 = zn + uVar8;
              iVar5 = order;
              do {
                pp_Var1 = pp_Var12 + -1;
                p_Var3 = *pp_Var12;
                pp_Var12 = pp_Var12 + -1;
                N_VLinearSum(dVar2 - dVar13,(double)iVar5,p_Var3,*pp_Var1,p_Var3);
                bVar4 = 1 < iVar5;
                iVar5 = iVar5 + -1;
              } while (bVar4);
              N_VLinearSum(dVar2 - *(double *)(local_60 + (uVar11 & 0xffffffff) * 8 + -8),
                           0x3ff0000000000000,*zn,wrk[uVar11 & 0xffffffff],*zn);
              iVar5 = (int)uVar6;
              uVar6 = uVar11;
            } while (1 < iVar5);
          }
          N_VScale(0x3ff0000000000000,*y,*zn);
          N_VScale(0x3ff0000000000000,f,zn[1]);
          iVar9 = 0;
          if (0 < order) {
            uVar8 = 1;
            do {
              N_VScale(zn[uVar8],zn[uVar8]);
              uVar8 = uVar8 + 1;
            } while (order + 1 != uVar8);
          }
        }
      }
    }
  }
  return iVar9;
}

Assistant:

static int cvBuildNordsieckArrayBDF(sunrealtype* t, N_Vector* y, N_Vector f,
                                    N_Vector* wrk, int order,
                                    sunrealtype hscale, N_Vector* zn)
{
  /* Check for valid inputs */
  if (!t || !y || !f || !wrk || order < 1 || !zn) { return CV_ILL_INPUT; }

  for (int i = 0; i < order; i++)
  {
    if (!y[i]) { return CV_ILL_INPUT; }
  }

  for (int i = 0; i < order + 1; i++)
  {
    if (!wrk[i]) { return CV_ILL_INPUT; }
  }

  /* Compute Nordsieck array */
  if (order > 1)
  {
    /* Setup extended array of times to incorporate derivative value */
    sunrealtype t_ext[BDF_Q_MAX + 1];

    t_ext[0] = t[0];
    for (int i = 1; i <= order; i++) { t_ext[i] = t[i - 1]; }

    /* Compute Hermite polynomial coefficients interpolating y history and f */
    N_VScale(ONE, y[0], wrk[0]);
    for (int i = 1; i <= order; i++) { N_VScale(ONE, y[i - 1], wrk[i]); }

    for (int i = 1; i <= order; i++)
    {
      for (int j = order; j > i - 1; j--)
      {
        if (i == 1 && j == 1)
        {
          /* Replace with actual derivative value */
          N_VScale(ONE, f, wrk[j]);
        }
        else
        {
          /* Divided difference */
          sunrealtype delta_t = ONE / (t_ext[j - i] - t_ext[j]);
          N_VLinearSum(delta_t, wrk[j - 1], -delta_t, wrk[j], wrk[j]);
        }
      }
    }

    /* Compute derivatives of Hermite polynomial */
    N_VScale(ONE, wrk[order], zn[0]);
    for (int i = 1; i <= order; i++) { N_VConst(ZERO, zn[i]); }

    for (int i = order - 1; i >= 0; i--)
    {
      for (int j = order; j > 0; j--)
      {
        N_VLinearSum(t_ext[0] - t_ext[i], zn[j], j, zn[j - 1], zn[j]);
      }
      N_VLinearSum(t_ext[0] - t_ext[i], zn[0], ONE, wrk[i], zn[0]);
    }
  }

  /* Overwrite first two columns with input values */
  N_VScale(ONE, y[0], zn[0]);
  N_VScale(ONE, f, zn[1]);

  /* Scale entries */
  sunrealtype scale = ONE;
  for (int i = 1; i <= order; i++)
  {
    scale *= hscale / ((sunrealtype)i);
    N_VScale(scale, zn[i], zn[i]);
  }

  return CV_SUCCESS;
}